

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eci.cc
# Opt level: O0

CoordGeodetic * __thiscall libsgp4::Eci::ToGeodetic(CoordGeodetic *__return_storage_ptr__,Eci *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool local_81;
  double alt;
  double sinphi;
  int cnt;
  double c;
  double phi;
  double lat;
  double r;
  double lon;
  double theta;
  Eci *this_local;
  
  dVar1 = Util::AcTan((this->m_position).y,(this->m_position).x);
  dVar2 = DateTime::ToGreenwichSiderealTime(&this->m_dt);
  dVar1 = Util::WrapNegPosPI(dVar1 - dVar2);
  dVar2 = sqrt((this->m_position).x * (this->m_position).x +
               (this->m_position).y * (this->m_position).y);
  phi = Util::AcTan((this->m_position).z,dVar2);
  sinphi._4_4_ = 0;
  do {
    dVar3 = sin(phi);
    dVar4 = sqrt(-(dVar3 * 0.006694317778266723) * dVar3 + 1.0);
    dVar3 = Util::AcTan((1.0 / dVar4) * 6378.135 * 0.006694317778266723 * dVar3 +
                        (this->m_position).z,dVar2);
    sinphi._4_4_ = sinphi._4_4_ + 1;
    local_81 = 1e-10 <= ABS(dVar3 - phi) && sinphi._4_4_ < 10;
    phi = dVar3;
  } while (local_81);
  dVar5 = cos(dVar3);
  CoordGeodetic::CoordGeodetic
            (__return_storage_ptr__,dVar3,dVar1,(1.0 / dVar4) * -6378.135 + dVar2 / dVar5,true);
  return __return_storage_ptr__;
}

Assistant:

CoordGeodetic Eci::ToGeodetic() const
{
    const double theta = Util::AcTan(m_position.y, m_position.x);

    const double lon = Util::WrapNegPosPI(theta
            - m_dt.ToGreenwichSiderealTime());

    const double r = sqrt((m_position.x * m_position.x)
            + (m_position.y * m_position.y));

    static const double e2 = kF * (2.0 - kF);

    double lat = Util::AcTan(m_position.z, r);
    double phi = 0.0;
    double c = 0.0;
    int cnt = 0;

    do
    {
        phi = lat;
        const double sinphi = sin(phi);
        c = 1.0 / sqrt(1.0 - e2 * sinphi * sinphi);
        lat = Util::AcTan(m_position.z + kXKMPER * c * e2 * sinphi, r);
        cnt++;
    }
    while (fabs(lat - phi) >= 1e-10 && cnt < 10);

    const double alt = r / cos(lat) - kXKMPER * c;

    return CoordGeodetic(lat, lon, alt, true);
}